

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

Float pbrt::BeamDiffusionMS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float x;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  Float FVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar23 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 local_ac;
  undefined4 local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar26._4_60_ = in_register_00001244;
  auVar26._0_4_ = sigma_a;
  fVar5 = (1.0 - g) * sigma_s;
  fVar1 = fVar5 + sigma_a;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)fVar5),auVar26._0_16_,ZEXT416(0x40000000));
  fVar12 = auVar10._0_4_ / (fVar1 * fVar1 * 3.0);
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  auVar17._0_4_ = sigma_a / fVar12;
  auVar17._4_12_ = in_register_00001244._0_12_;
  local_ac = 0.0;
  auVar10 = vmaxss_avx(auVar17,auVar27);
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  FVar13 = FresnelMoment1(eta);
  auVar21._0_4_ = FresnelMoment2(eta);
  auVar21._4_60_ = extraout_var;
  iVar9 = 0;
  auVar30 = SUB6416(ZEXT464(0x3f800000),0);
  auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar21._0_16_,auVar30);
  auVar17 = vfmadd132ss_fma(auVar21._0_16_,auVar30,ZEXT416(0xc0400000));
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)FVar13),SUB6416(ZEXT464(0xc0000000),0),auVar30);
  local_58 = auVar10._0_4_;
  auVar18._4_4_ = local_58;
  auVar18._0_4_ = local_58;
  auVar18._8_4_ = local_58;
  auVar18._12_4_ = local_58;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar18,auVar10);
  while (iVar9 != 100) {
    auVar22._0_4_ = logf(((float)iVar9 + 0.5) / -100.0 + 1.0);
    auVar22._4_60_ = extraout_var_00;
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar22._0_16_,auVar11);
    auVar28._0_4_ = auVar11._0_4_ / fVar1;
    auVar28._4_12_ = auVar11._4_12_;
    auVar11 = vfmsub231ss_fma(auVar28,SUB6416(ZEXT464(0x40000000),0),
                              ZEXT416((uint)((fVar12 * -2.0 * auVar27._0_4_) / auVar30._0_4_)));
    auVar6._4_4_ = r;
    auVar6._0_4_ = r;
    auVar6._8_4_ = r;
    auVar6._12_4_ = r;
    auVar11 = vinsertps_avx(auVar28,auVar11,0x10);
    fVar16 = auVar11._0_4_;
    auVar19._0_4_ = fVar16 * fVar16;
    fVar3 = auVar11._4_4_;
    auVar19._4_4_ = fVar3 * fVar3;
    fVar4 = auVar11._8_4_;
    fVar7 = auVar11._12_4_;
    auVar19._8_4_ = fVar4 * fVar4;
    auVar19._12_4_ = fVar7 * fVar7;
    auVar11 = vfmadd231ps_fma(auVar19,auVar6,auVar6);
    auVar6 = vsqrtps_avx(auVar11);
    local_58 = auVar10._0_4_;
    fVar14 = auVar6._0_4_;
    fVar15 = FastExp(fVar14 * local_58);
    auVar11 = vmovshdup_avx(auVar6);
    x = auVar11._0_4_ * local_58;
    auVar23._0_4_ = FastExp(x);
    auVar23._4_60_ = extraout_var_01;
    auVar2._4_4_ = extraout_XMM0_Db;
    auVar2._0_4_ = fVar15;
    auVar2._8_4_ = extraout_XMM0_Dc;
    auVar2._12_4_ = extraout_XMM0_Dd;
    auVar11 = vinsertps_avx(auVar2,auVar23._0_16_,0x10);
    auVar11 = vdivps_avx(auVar11,auVar6);
    auVar2 = vhsubps_avx(auVar11,auVar11);
    fVar15 = FastExp(fVar14 * local_58);
    auVar24._0_4_ = FastExp(x);
    auVar24._4_60_ = extraout_var_02;
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar19 = vfmadd132ps_fma(auVar6,auVar29,auVar18);
    auVar8._4_4_ = extraout_XMM0_Db_00;
    auVar8._0_4_ = fVar15;
    auVar8._8_4_ = extraout_XMM0_Dc_00;
    auVar8._12_4_ = extraout_XMM0_Dd_00;
    auVar11 = vinsertps_avx(auVar8,auVar24._0_16_,0x10);
    auVar20._0_4_ = auVar11._0_4_ * auVar19._0_4_ * fVar16;
    auVar20._4_4_ = auVar11._4_4_ * auVar19._4_4_ * fVar3;
    auVar20._8_4_ = auVar11._8_4_ * auVar19._8_4_ * fVar4;
    auVar20._12_4_ = auVar11._12_4_ * auVar19._12_4_ * fVar7;
    fVar16 = auVar6._4_4_;
    fVar3 = auVar6._8_4_;
    fVar4 = auVar6._12_4_;
    auVar25._0_4_ = fVar14 * fVar14 * fVar14;
    auVar25._4_4_ = fVar16 * fVar16 * fVar16;
    auVar25._8_4_ = fVar3 * fVar3 * fVar3;
    auVar25._12_4_ = fVar4 * fVar4 * fVar4;
    auVar11 = vdivps_avx(auVar20,auVar25);
    auVar11 = vhsubps_avx(auVar11,auVar11);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * 0.07957747 * auVar17._0_4_ * 0.5)),
                              ZEXT416((uint)(auVar2._0_4_ * (0.07957747 / fVar12))),
                              ZEXT416((uint)(auVar30._0_4_ * 0.25)));
    fVar16 = FastExp((fVar14 + auVar28._0_4_) * fVar1 * -2.0);
    iVar9 = iVar9 + 1;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)local_ac),
                              ZEXT416((uint)((fVar5 / fVar1) * (fVar5 / fVar1) * (1.0 - fVar16))),
                              ZEXT416(auVar11._0_4_));
    local_ac = auVar11._0_4_;
  }
  return local_ac / 100.0;
}

Assistant:

Float BeamDiffusionMS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    const int nSamples = 100;
    Float Ed = 0;
    // Precompute information for dipole integrand
    // Compute reduced scattering coefficients $\sigmaps, \sigmapt$ and albedo $\rhop$
    Float sigmap_s = sigma_s * (1 - g);
    Float sigmap_t = sigma_a + sigmap_s;
    Float rhop = sigmap_s / sigmap_t;

    // Compute non-classical diffusion coefficient $D_\roman{G}$ using Equation
    // $(\ref{eq:diffusion-coefficient-grosjean})$
    Float D_g = (2 * sigma_a + sigmap_s) / (3 * sigmap_t * sigmap_t);

    // Compute effective transport coefficient $\sigmatr$ based on $D_\roman{G}$
    Float sigma_tr = SafeSqrt(sigma_a / D_g);

    // Determine linear extrapolation distance $\depthextrapolation$ using Equation
    // $(\ref{eq:dipole-boundary-condition})$
    Float fm1 = FresnelMoment1(eta), fm2 = FresnelMoment2(eta);
    Float ze = -2 * D_g * (1 + 3 * fm2) / (1 - 2 * fm1);

    // Determine exitance scale factors using Equations $(\ref{eq:kp-exitance-phi})$ and
    // $(\ref{eq:kp-exitance-e})$
    Float cPhi = .25f * (1 - 2 * fm1), cE = .5f * (1 - 3 * fm2);

    for (int i = 0; i < nSamples; ++i) {
        // Sample real point source depth $\depthreal$
        Float zr = -std::log(1 - (i + .5f) / nSamples) / sigmap_t;

        // Evaluate dipole integrand $E_{\roman{d}}$ at $\depthreal$ and add to _Ed_
        Float zv = -zr + 2 * ze;
        Float dr = std::sqrt(r * r + zr * zr), dv = std::sqrt(r * r + zv * zv);
        // Compute dipole fluence rate $\dipole(r)$ using Equation
        // $(\ref{eq:diffusion-dipole})$
        Float phiD =
            Inv4Pi / D_g * (FastExp(-sigma_tr * dr) / dr - FastExp(-sigma_tr * dv) / dv);

        // Compute dipole vector irradiance $-\N{}\cdot\dipoleE(r)$ using Equation
        // $(\ref{eq:diffusion-dipole-vector-irradiance-normal})$
        Float EDn = Inv4Pi *
                    (zr * (1 + sigma_tr * dr) * FastExp(-sigma_tr * dr) / (dr * dr * dr) -
                     zv * (1 + sigma_tr * dv) * FastExp(-sigma_tr * dv) / (dv * dv * dv));

        // Add contribution from dipole for depth $\depthreal$ to _Ed_
        Float E = phiD * cPhi + EDn * cE;
        Float kappa = 1 - FastExp(-2 * sigmap_t * (dr + zr));
        Ed += kappa * rhop * rhop * E;
    }
    return Ed / nSamples;
}